

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O0

SecretDataStruct *
cfd::js::api::json::SchnorrApi::ExtractSecretEcdsaAdaptor
          (SecretDataStruct *__return_storage_ptr__,ExtractSecretEcdsaAdaptorRequestStruct *request)

{
  ExtractSecretEcdsaAdaptorRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ExtractSecretEcdsaAdaptorRequestStruct *pEStack_18;
  anon_class_1_0_00000001 call_func;
  ExtractSecretEcdsaAdaptorRequestStruct *request_local;
  SecretDataStruct *result;
  
  local_1a = 0;
  pEStack_18 = request;
  SecretDataStruct::SecretDataStruct(__return_storage_ptr__);
  this = pEStack_18;
  std::
  function<cfd::js::api::SecretDataStruct(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&)>
  ::
  function<cfd::js::api::json::SchnorrApi::ExtractSecretEcdsaAdaptor(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::SecretDataStruct(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"ExtractSecretEcdsaAdaptor",&local_129);
  ExecuteStructApi<cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct,cfd::js::api::SecretDataStruct>
            ((SecretDataStruct *)(local_108 + 0x20),(api *)this,
             (ExtractSecretEcdsaAdaptorRequestStruct *)local_108,&local_128,in_R8);
  SecretDataStruct::operator=(__return_storage_ptr__,(SecretDataStruct *)(local_108 + 0x20));
  SecretDataStruct::~SecretDataStruct((SecretDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  ::~function((function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

SecretDataStruct SchnorrApi::ExtractSecretEcdsaAdaptor(
    const ExtractSecretEcdsaAdaptorRequestStruct& request) {
  auto call_func = [](const ExtractSecretEcdsaAdaptorRequestStruct& request)
      -> SecretDataStruct {
    SecretDataStruct response;

    Pubkey adaptor(request.adaptor);
    AdaptorSignature adaptor_signature(request.adaptor_signature);
    ByteData signature(request.signature);

    auto secret =
        AdaptorUtil::ExtractSecret(adaptor_signature, signature, adaptor);
    response.secret = secret.GetHex();
    return response;
  };

  SecretDataStruct result;
  result = ExecuteStructApi<
      ExtractSecretEcdsaAdaptorRequestStruct, SecretDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}